

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

CPpmd_Void_Ref CutOff(CPpmd8 *p,CTX_PTR ctx,uint order)

{
  byte bVar1;
  byte bVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  Byte *pBVar5;
  uint oldNU;
  uint uVar6;
  uint uVar7;
  Byte *pBVar8;
  long lVar9;
  CTX_PTR pCVar10;
  ulong uVar11;
  byte *pbVar12;
  int iVar13;
  Byte *pBVar14;
  CPpmd_Void_Ref CVar15;
  ulong uVar16;
  uint uVar17;
  byte *pbVar18;
  ulong uVar19;
  
  bVar1 = ctx->NumStats;
  uVar19 = (ulong)bVar1;
  uVar6 = (uint)bVar1;
  pBVar14 = p->Base;
  if (bVar1 == 0) {
    if ((CTX_PTR)p->UnitsStart <= (CTX_PTR)(pBVar14 + ctx->Stats)) {
      if (order < p->MaxOrder) {
        CVar15 = CutOff(p,(CTX_PTR)(pBVar14 + ctx->Stats),order + 1);
        *(short *)&ctx->Stats = (short)CVar15;
        uVar6 = CVar15 >> 0x10;
      }
      else {
        *(undefined2 *)&ctx->Stats = 0;
        uVar6 = 0;
      }
      *(short *)((long)&ctx->Stats + 2) = (short)uVar6;
      if ((order < 10) || (uVar6 != 0 || (short)ctx->Stats != 0)) goto LAB_0018ad70;
    }
    pCVar10 = (CTX_PTR)p->UnitsStart;
    if (pCVar10 == ctx) {
LAB_0018acfd:
      p->UnitsStart = &pCVar10[1].NumStats;
    }
    else {
      ctx->NumStats = 0xff;
      ctx->Flags = 0xff;
      ctx->SummFreq = 0xffff;
      ctx->Stats = p->FreeList[0];
      ctx->Suffix = (uint)p->Indx2Units[0];
      iVar13 = *(int *)&p->Base;
LAB_0018aced:
      p->FreeList[0] = (int)ctx - iVar13;
      p->Stamps[0] = p->Stamps[0] + 1;
    }
    CVar15 = 0;
  }
  else {
    uVar7 = ctx->Stats;
    uVar11 = (ulong)uVar7;
    pBVar8 = pBVar14 + uVar11;
    oldNU = bVar1 + 2 >> 1;
    uVar17 = oldNU - 1;
    pBVar5 = p->UnitsStart;
    if (pBVar8 <= pBVar5 + 0x4000) {
      bVar2 = p->Units2Indx[uVar17];
      uVar16 = (ulong)p->FreeList[bVar2];
      if (uVar7 <= p->FreeList[bVar2]) {
        p->FreeList[bVar2] = *(CPpmd_Void_Ref *)(pBVar14 + uVar16 + 4);
        p->Stamps[bVar2] = p->Stamps[bVar2] - 1;
        lVar9 = 0;
        do {
          *(undefined4 *)(pBVar14 + lVar9 + uVar16) = *(undefined4 *)(pBVar14 + lVar9 + uVar11);
          *(undefined4 *)(pBVar14 + lVar9 + uVar16 + 4) =
               *(undefined4 *)(pBVar14 + lVar9 + uVar11 + 4);
          *(undefined4 *)(pBVar14 + lVar9 + uVar16 + 8) =
               *(undefined4 *)(pBVar14 + lVar9 + uVar11 + 8);
          lVar9 = lVar9 + 0xc;
        } while (((uint)bVar1 * 2 + 4 & 0xfffffffc) * 3 != (int)lVar9);
        if (pBVar5 == pBVar8) {
          p->UnitsStart = pBVar5 + (ulong)p->Indx2Units[bVar2] * 0xc;
          pBVar8 = pBVar14 + uVar16;
        }
        else {
          pBVar8[0] = 0xff;
          pBVar8[1] = 0xff;
          pBVar8[2] = 0xff;
          pBVar8[3] = 0xff;
          *(CPpmd_Void_Ref *)(pBVar8 + 4) = p->FreeList[bVar2];
          *(uint *)(pBVar8 + 8) = (uint)p->Indx2Units[bVar2];
          p->FreeList[bVar2] = uVar7;
          p->Stamps[bVar2] = p->Stamps[bVar2] + 1;
          pBVar8 = pBVar14 + uVar16;
        }
      }
    }
    uVar7 = (uint)((long)pBVar8 - (long)pBVar14);
    ctx->Stats = uVar7;
    uVar11 = (long)pBVar8 - (long)pBVar14 & 0xffffffff;
    pbVar18 = pBVar14 + uVar19 * 6 + uVar11;
    pBVar14 = p->Base;
    pbVar12 = pBVar14 + uVar11;
    if (pbVar12 <= pbVar18) {
      do {
        if ((CTX_PTR)(pBVar14 + *(uint *)(pbVar18 + 2)) < (CTX_PTR)p->UnitsStart) {
          lVar9 = (long)(int)uVar19;
          uVar19 = (ulong)((int)uVar19 - 1);
          pbVar18[2] = 0;
          pbVar18[3] = 0;
          pbVar18[4] = 0;
          pbVar18[5] = 0;
          uVar3 = *(undefined2 *)(pbVar18 + 4);
          uVar4 = *(undefined4 *)pbVar18;
          *(undefined2 *)(pbVar18 + 4) = *(undefined2 *)(pbVar12 + lVar9 * 6 + 4);
          *(undefined4 *)pbVar18 = *(undefined4 *)(pbVar12 + lVar9 * 6);
          *(undefined2 *)(pbVar12 + lVar9 * 6 + 4) = uVar3;
          *(undefined4 *)(pbVar12 + lVar9 * 6) = uVar4;
        }
        else if (order < p->MaxOrder) {
          CVar15 = CutOff(p,(CTX_PTR)(pBVar14 + *(uint *)(pbVar18 + 2)),order + 1);
          *(CPpmd_Void_Ref *)(pbVar18 + 2) = CVar15;
        }
        else {
          pbVar18[2] = 0;
          pbVar18[3] = 0;
          pbVar18[4] = 0;
          pbVar18[5] = 0;
        }
        uVar6 = (uint)uVar19;
        pbVar18 = pbVar18 + -6;
        pBVar14 = p->Base;
        uVar7 = ctx->Stats;
        pbVar12 = pBVar14 + uVar7;
      } while (pbVar12 <= pbVar18);
    }
    if ((order != 0) && (uVar6 != ctx->NumStats)) {
      ctx->NumStats = (Byte)uVar6;
      if ((int)uVar6 < 0) {
        bVar1 = p->Units2Indx[uVar17];
        pbVar12[0] = 0xff;
        pbVar12[1] = 0xff;
        pbVar12[2] = 0xff;
        pbVar12[3] = 0xff;
        *(CPpmd_Void_Ref *)(pbVar12 + 4) = p->FreeList[bVar1];
        *(uint *)(pbVar12 + 8) = (uint)p->Indx2Units[bVar1];
        p->FreeList[bVar1] = uVar7;
        p->Stamps[bVar1] = p->Stamps[bVar1] + 1;
        pCVar10 = (CTX_PTR)p->UnitsStart;
        if (pCVar10 == ctx) goto LAB_0018acfd;
        ctx->NumStats = 0xff;
        ctx->Flags = 0xff;
        ctx->SummFreq = 0xffff;
        ctx->Stats = p->FreeList[0];
        ctx->Suffix = (uint)p->Indx2Units[0];
        iVar13 = (int)pBVar14;
        goto LAB_0018aced;
      }
      if (uVar6 == 0) {
        ctx->Flags = (0x3f < *pbVar12) << 3 | ctx->Flags & 0x10;
        *(undefined4 *)&ctx->SummFreq = *(undefined4 *)pbVar12;
        *(undefined2 *)((long)&ctx->Stats + 2) = *(undefined2 *)(pbVar12 + 4);
        bVar1 = p->Units2Indx[uVar17];
        pbVar12[0] = 0xff;
        pbVar12[1] = 0xff;
        pbVar12[2] = 0xff;
        pbVar12[3] = 0xff;
        *(CPpmd_Void_Ref *)(pbVar12 + 4) = p->FreeList[bVar1];
        *(uint *)(pbVar12 + 8) = (uint)p->Indx2Units[bVar1];
        p->FreeList[bVar1] = (int)pbVar12 - *(int *)&p->Base;
        p->Stamps[bVar1] = p->Stamps[bVar1] + 1;
        *(char *)((long)&ctx->SummFreq + 1) = (char)(*(byte *)((long)&ctx->SummFreq + 1) + 0xb >> 3)
        ;
      }
      else {
        Refresh(p,ctx,oldNU,(uint)((int)(uVar6 * 0x10) < (int)(uint)ctx->SummFreq));
      }
    }
LAB_0018ad70:
    CVar15 = (int)ctx - *(int *)&p->Base;
  }
  return CVar15;
}

Assistant:

static CPpmd_Void_Ref CutOff(CPpmd8 *p, CTX_PTR ctx, unsigned order)
{
  int i;
  unsigned tmp;
  CPpmd_State *s;
  
  if (!ctx->NumStats)
  {
    s = ONE_STATE(ctx);
    if ((Byte *)Ppmd8_GetPtr(p, SUCCESSOR(s)) >= p->UnitsStart)
    {
      if (order < p->MaxOrder)
        SetSuccessor(s, CutOff(p, CTX(SUCCESSOR(s)), order + 1));
      else
        SetSuccessor(s, 0);
      if (SUCCESSOR(s) || order <= 9) /* O_BOUND */
        return REF(ctx);
    }
    SpecialFreeUnit(p, ctx);
    return 0;
  }

  ctx->Stats = STATS_REF(MoveUnitsUp(p, STATS(ctx), tmp = ((unsigned)ctx->NumStats + 2) >> 1));

  for (s = STATS(ctx) + (i = ctx->NumStats); s >= STATS(ctx); s--)
    if ((Byte *)Ppmd8_GetPtr(p, SUCCESSOR(s)) < p->UnitsStart)
    {
      CPpmd_State *s2 = STATS(ctx) + (i--);
      SetSuccessor(s, 0);
      SwapStates(s, s2);
    }
    else if (order < p->MaxOrder)
      SetSuccessor(s, CutOff(p, CTX(SUCCESSOR(s)), order + 1));
    else
      SetSuccessor(s, 0);
    
  if (i != ctx->NumStats && order)
  {
    ctx->NumStats = (Byte)i;
    s = STATS(ctx);
    if (i < 0)
    {
      FreeUnits(p, s, tmp);
      SpecialFreeUnit(p, ctx);
      return 0;
    }
    if (i == 0)
    {
      ctx->Flags = (Byte)((ctx->Flags & 0x10) + 0x08 * (s->Symbol >= 0x40));
      *ONE_STATE(ctx) = *s;
      FreeUnits(p, s, tmp);
      /* 9.31: the code was fixed. It's was not BUG, if Freq <= MAX_FREQ = 124 */
      ONE_STATE(ctx)->Freq = (Byte)(((unsigned)ONE_STATE(ctx)->Freq + 11) >> 3);
    }
    else
      Refresh(p, ctx, tmp, ctx->SummFreq > 16 * i);
  }
  return REF(ctx);
}